

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O0

int run_test_udp_no_autobind(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_udp_t h2;
  uv_udp_t h;
  uv_loop_t *loop;
  
  loop_00 = uv_default_loop();
  iVar1 = uv_udp_init(loop_00,(uv_udp_t *)&h2.write_completed_queue.prev);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x7a,"uv_udp_init(loop, &h)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_set_multicast_ttl((uv_udp_t *)&h2.write_completed_queue.prev,0x20);
  if ((long)iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x7b,"UV_EBADF","==","uv_udp_set_multicast_ttl(&h, 32)",0xfffffffffffffff7,"==",
            (long)iVar1);
    abort();
  }
  iVar1 = uv_udp_set_broadcast((uv_udp_t *)&h2.write_completed_queue.prev,1);
  if ((long)iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x7c,"UV_EBADF","==","uv_udp_set_broadcast(&h, 1)",0xfffffffffffffff7,"==",(long)iVar1)
    ;
    abort();
  }
  iVar1 = uv_udp_set_ttl((uv_udp_t *)&h2.write_completed_queue.prev,1);
  if ((long)iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x80,"UV_EBADF","==","uv_udp_set_ttl(&h, 1)",0xfffffffffffffff7,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_udp_set_multicast_loop((uv_udp_t *)&h2.write_completed_queue.prev,1);
  if ((long)iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x82,"UV_EBADF","==","uv_udp_set_multicast_loop(&h, 1)",0xfffffffffffffff7,"==",
            (long)iVar1);
    abort();
  }
  iVar1 = uv_udp_set_multicast_interface((uv_udp_t *)&h2.write_completed_queue.prev,"0.0.0.0");
  if ((long)iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x87,"UV_EBADF","==","uv_udp_set_multicast_interface(&h, \"0.0.0.0\")",
            0xfffffffffffffff7,"==",(long)iVar1);
    abort();
  }
  uv_close((uv_handle_t *)&h2.write_completed_queue.prev,(uv_close_cb)0x0);
  iVar1 = uv_udp_init_ex(loop_00,(uv_udp_t *)&eval_a,0x102);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x8c,"uv_udp_init_ex(loop, &h2, 2 | UV_UDP_RECVMMSG)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_set_multicast_ttl((uv_udp_t *)&eval_a,0x20);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x8d,"uv_udp_set_multicast_ttl(&h2, 32)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_set_broadcast((uv_udp_t *)&eval_a,1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x8e,"uv_udp_set_broadcast(&h2, 1)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_set_ttl((uv_udp_t *)&eval_a,1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x94,"uv_udp_set_ttl(&h2, 1)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_set_multicast_loop((uv_udp_t *)&eval_a,1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x97,"uv_udp_set_multicast_loop(&h2, 1)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_set_multicast_interface((uv_udp_t *)&eval_a,"0.0.0.0");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x98,"uv_udp_set_multicast_interface(&h2, \"0.0.0.0\")","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)&eval_a,(uv_close_cb)0x0);
  iVar1 = uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x9c,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-options.c"
            ,0x9e,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_no_autobind) {
  uv_loop_t* loop;
  uv_udp_t h;
  uv_udp_t h2;

  loop = uv_default_loop();

  /* Test a lazy initialized socket. */
  ASSERT_OK(uv_udp_init(loop, &h));
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_ttl(&h, 32));
  ASSERT_EQ(UV_EBADF, uv_udp_set_broadcast(&h, 1));
#if defined(__MVS__)
  ASSERT_EQ(UV_ENOTSUP, uv_udp_set_ttl(&h, 1));
#else
  ASSERT_EQ(UV_EBADF, uv_udp_set_ttl(&h, 1));
#endif
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_loop(&h, 1));
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  ASSERT_EQ(UV_EBADF, uv_udp_set_multicast_interface(&h, "0.0.0.0"));

  uv_close((uv_handle_t*) &h, NULL);

  /* Test a non-lazily initialized socket. */
  ASSERT_OK(uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG));
  ASSERT_OK(uv_udp_set_multicast_ttl(&h2, 32));
  ASSERT_OK(uv_udp_set_broadcast(&h2, 1));

#if defined(__MVS__)
  /* zOS only supports setting ttl for IPv6 sockets. */
  ASSERT_EQ(UV_ENOTSUP, uv_udp_set_ttl(&h2, 1));
#else
  ASSERT_OK(uv_udp_set_ttl(&h2, 1));
#endif

  ASSERT_OK(uv_udp_set_multicast_loop(&h2, 1));
  ASSERT_OK(uv_udp_set_multicast_interface(&h2, "0.0.0.0"));

  uv_close((uv_handle_t*) &h2, NULL);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}